

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signal_ports.cpp
# Opt level: O0

void __thiscall sc_core::sc_inout<sc_dt::sc_logic>::remove_traces(sc_inout<sc_dt::sc_logic> *this)

{
  sc_trace_params *psVar1;
  void *pvVar2;
  size_type sVar3;
  reference ppsVar4;
  long in_RDI;
  int i;
  undefined4 in_stack_fffffffffffffff0;
  int iVar5;
  
  if (*(long *)(in_RDI + 0xa0) != 0) {
    sVar3 = std::vector<sc_core::sc_trace_params_*,_std::allocator<sc_core::sc_trace_params_*>_>::
            size(*(vector<sc_core::sc_trace_params_*,_std::allocator<sc_core::sc_trace_params_*>_>
                   **)(in_RDI + 0xa0));
    iVar5 = (int)sVar3;
    while (iVar5 = iVar5 + -1, -1 < iVar5) {
      ppsVar4 = std::vector<sc_core::sc_trace_params_*,_std::allocator<sc_core::sc_trace_params_*>_>
                ::operator[](*(vector<sc_core::sc_trace_params_*,_std::allocator<sc_core::sc_trace_params_*>_>
                               **)(in_RDI + 0xa0),(long)iVar5);
      psVar1 = *ppsVar4;
      if (psVar1 != (sc_trace_params *)0x0) {
        sc_trace_params::~sc_trace_params((sc_trace_params *)0x2395ef);
        operator_delete(psVar1);
      }
    }
    pvVar2 = *(void **)(in_RDI + 0xa0);
    if (pvVar2 != (void *)0x0) {
      std::vector<sc_core::sc_trace_params_*,_std::allocator<sc_core::sc_trace_params_*>_>::~vector
                ((vector<sc_core::sc_trace_params_*,_std::allocator<sc_core::sc_trace_params_*>_> *)
                 CONCAT44(iVar5,in_stack_fffffffffffffff0));
      operator_delete(pvVar2);
    }
    *(undefined8 *)(in_RDI + 0xa0) = 0;
  }
  return;
}

Assistant:

void
sc_inout<sc_dt::sc_logic>::remove_traces() const
{
    if( m_traces != 0 ) {
	for( int i = m_traces->size() - 1; i >= 0; -- i ) {
	    delete (*m_traces)[i];
	}
	delete m_traces;
	m_traces = 0;
    }
}